

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

void __thiscall DataFrame::print(DataFrame *this,int rows_number)

{
  pointer pvVar1;
  long lVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  size_t j;
  ulong uVar6;
  
  std::operator<<((ostream *)&std::cout,"Printig data:\n");
  for (lVar4 = 0; lVar4 != rows_number; lVar4 = lVar4 + 1) {
    lVar5 = 0;
    for (uVar6 = 0;
        pvVar1 = (this->data).
                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        lVar2 = *(long *)&pvVar1[lVar4].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data,
        uVar6 < (ulong)((long)*(pointer *)
                               ((long)&pvVar1[lVar4].
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data + 8) - lVar2 >> 5);
        uVar6 = uVar6 + 1) {
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)(lVar2 + lVar5));
      std::operator<<(poVar3," ");
      lVar5 = lVar5 + 0x20;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  return;
}

Assistant:

void DataFrame::print(int rows_number)
{

    std::cout<< "Printig data:\n";
    for (size_t i = 0; i < rows_number; i++) {
        for (size_t j = 0; j < data[i].size(); j++) {
            std::cout << data[i][j] << " ";
        }
        std::cout << std::endl;
    }

}